

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

ssize_t __thiscall
fmt::BasicWriter<char>::write(BasicWriter<char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  BasicWriter<char> *in_stack_ffffffffffffff90;
  ArgList *in_stack_ffffffffffffff98;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *in_stack_ffffffffffffffa0;
  
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::BasicFormatter
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::format
            ((BasicFormatter<char,_fmt::ArgFormatter<char>_> *)__buf,(BasicCStringRef<char>)__n);
  BasicFormatter<char,_fmt::ArgFormatter<char>_>::~BasicFormatter
            ((BasicFormatter<char,_fmt::ArgFormatter<char>_> *)0x13bd64);
  return extraout_RAX;
}

Assistant:

void write(BasicCStringRef<Char> format, ArgList args) {
    BasicFormatter<Char>(args, *this).format(format);
  }